

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

aom_metadata_array_t * aom_img_metadata_array_alloc(size_t sz)

{
  aom_metadata_t **ppaVar1;
  aom_metadata_array_t *in_RDI;
  aom_metadata_array_t *arr;
  aom_metadata_array_t *local_8;
  
  local_8 = (aom_metadata_array_t *)calloc(1,0x10);
  if (local_8 == (aom_metadata_array_t *)0x0) {
    local_8 = (aom_metadata_array_t *)0x0;
  }
  else if (in_RDI != (aom_metadata_array_t *)0x0) {
    ppaVar1 = (aom_metadata_t **)calloc((size_t)in_RDI,8);
    local_8->metadata_array = ppaVar1;
    if (local_8->metadata_array == (aom_metadata_t **)0x0) {
      aom_img_metadata_array_free(in_RDI);
      local_8 = (aom_metadata_array_t *)0x0;
    }
    else {
      local_8->sz = (size_t)in_RDI;
    }
  }
  return local_8;
}

Assistant:

aom_metadata_array_t *aom_img_metadata_array_alloc(size_t sz) {
  aom_metadata_array_t *arr =
      (aom_metadata_array_t *)calloc(1, sizeof(aom_metadata_array_t));
  if (!arr) return NULL;
  if (sz > 0) {
    arr->metadata_array =
        (aom_metadata_t **)calloc(sz, sizeof(aom_metadata_t *));
    if (!arr->metadata_array) {
      aom_img_metadata_array_free(arr);
      return NULL;
    }
    arr->sz = sz;
  }
  return arr;
}